

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O3

void __thiscall
TEST_MockComparatorCopierTest_shouldSupportConstParameters_Test::testBody
          (TEST_MockComparatorCopierTest_shouldSupportConstParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SomeClass param;
  StubComparator comparator;
  SimpleString SStack_58;
  SimpleString local_48;
  SimpleString local_38;
  SimpleString local_28;
  undefined4 local_18;
  undefined4 local_14;
  undefined **local_10;
  
  local_10 = &PTR__MockNamedValueComparator_002b4a98;
  SimpleString::SimpleString(&SStack_58,"");
  pMVar2 = mock(&SStack_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_48,"SomeClass");
  (*pMVar2->_vptr_MockSupport[0x2c])(pMVar2,&local_48,&local_10);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&SStack_58);
  SimpleString::SimpleString(&SStack_58,"");
  pMVar2 = mock(&SStack_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_48,"functionWithConstParam");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_48);
  SimpleString::SimpleString(&local_28,"SomeClass");
  SimpleString::SimpleString(&local_38,"param");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_28,&local_38,&local_18);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&SStack_58);
  local_14 = local_18;
  SimpleString::SimpleString(&SStack_58,"");
  pMVar2 = mock(&SStack_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_48,"functionWithConstParam");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_48);
  SimpleString::SimpleString(&local_28,"SomeClass");
  SimpleString::SimpleString(&local_38,"param");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x20))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_28,&local_38,&local_14);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&SStack_58);
  SimpleString::SimpleString(&SStack_58,"");
  pMVar2 = mock(&SStack_58,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&SStack_58);
  return;
}

Assistant:

virtual bool isEqual(const void*, const void*) _override
    {
        return true;
    }